

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall cmFindLibraryHelper::CheckDirectory(cmFindLibraryHelper *this,string *path)

{
  Name *pNVar1;
  Name *pNVar2;
  bool bVar3;
  Name *name;
  
  pNVar2 = (this->Names).
           super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    name = pNVar2;
    pNVar1 = (this->Names).
             super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (name == pNVar1) break;
    bVar3 = CheckDirectoryForName(this,path,name);
    pNVar2 = name + 1;
  } while (!bVar3);
  return name != pNVar1;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectory(std::string const& path)
{
  for(std::vector<Name>::iterator i = this->Names.begin();
      i != this->Names.end(); ++i)
    {
    if(this->CheckDirectoryForName(path, *i))
      {
      return true;
      }
    }
  return false;
}